

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O2

void aom_yv12_copy_frame_c(YV12_BUFFER_CONFIG *src_bc,YV12_BUFFER_CONFIG *dst_bc,int num_planes)

{
  ulong uVar1;
  ulong uVar2;
  int row_1;
  int iVar3;
  int row;
  uint8_t *puVar4;
  uint8_t *puVar5;
  ulong uVar6;
  
  uVar1 = 0;
  if (0 < num_planes) {
    uVar1 = (ulong)(uint)num_planes;
  }
  if ((src_bc->flags & 8) == 0) {
    for (uVar2 = 0; uVar2 != uVar1; uVar2 = uVar2 + 1) {
      puVar4 = src_bc->store_buf_adr[uVar2 - 4];
      puVar5 = dst_bc->store_buf_adr[uVar2 - 4];
      for (iVar3 = 0;
          iVar3 < *(int *)((long)src_bc->store_buf_adr + (ulong)(uVar2 != 0) * 4 + -0x40);
          iVar3 = iVar3 + 1) {
        uVar6 = (ulong)((uint)(uVar2 != 0) * 4);
        memcpy(puVar5,puVar4,(long)*(int *)((long)src_bc->store_buf_adr + (uVar6 - 0x48)));
        puVar4 = puVar4 + *(int *)((long)src_bc->store_buf_adr + (uVar6 - 0x28));
        puVar5 = puVar5 + *(int *)((long)dst_bc->store_buf_adr + (uVar6 - 0x28));
      }
    }
  }
  else {
    for (uVar2 = 0; uVar2 != uVar1; uVar2 = uVar2 + 1) {
      puVar4 = src_bc->store_buf_adr[uVar2 - 4];
      puVar5 = dst_bc->store_buf_adr[uVar2 - 4];
      for (iVar3 = 0;
          iVar3 < *(int *)((long)src_bc->store_buf_adr + (ulong)(uVar2 != 0) * 4 + -0x40);
          iVar3 = iVar3 + 1) {
        uVar6 = (ulong)((uint)(uVar2 != 0) * 4);
        memcpy((void *)((long)puVar5 * 2),(void *)((long)puVar4 * 2),
               (long)*(int *)((long)src_bc->store_buf_adr + (uVar6 - 0x48)) * 2);
        puVar4 = puVar4 + *(int *)((long)src_bc->store_buf_adr + (uVar6 - 0x28));
        puVar5 = puVar5 + *(int *)((long)dst_bc->store_buf_adr + (uVar6 - 0x28));
      }
    }
  }
  aom_yv12_extend_frame_borders_c(dst_bc,num_planes);
  return;
}

Assistant:

void aom_yv12_copy_frame_c(const YV12_BUFFER_CONFIG *src_bc,
                           YV12_BUFFER_CONFIG *dst_bc, const int num_planes) {
  assert(src_bc->y_width == dst_bc->y_width);
  assert(src_bc->y_height == dst_bc->y_height);

#if CONFIG_AV1_HIGHBITDEPTH
  assert((src_bc->flags & YV12_FLAG_HIGHBITDEPTH) ==
         (dst_bc->flags & YV12_FLAG_HIGHBITDEPTH));

  if (src_bc->flags & YV12_FLAG_HIGHBITDEPTH) {
    for (int plane = 0; plane < num_planes; ++plane) {
      const uint8_t *plane_src = src_bc->buffers[plane];
      uint8_t *plane_dst = dst_bc->buffers[plane];
      const int is_uv = plane > 0;

      for (int row = 0; row < src_bc->heights[is_uv]; ++row) {
        memcpy_short_addr(plane_dst, plane_src, src_bc->widths[is_uv]);
        plane_src += src_bc->strides[is_uv];
        plane_dst += dst_bc->strides[is_uv];
      }
    }
    aom_yv12_extend_frame_borders_c(dst_bc, num_planes);
    return;
  }
#endif
  for (int plane = 0; plane < num_planes; ++plane) {
    const uint8_t *plane_src = src_bc->buffers[plane];
    uint8_t *plane_dst = dst_bc->buffers[plane];
    const int is_uv = plane > 0;

    for (int row = 0; row < src_bc->heights[is_uv]; ++row) {
      memcpy(plane_dst, plane_src, src_bc->widths[is_uv]);
      plane_src += src_bc->strides[is_uv];
      plane_dst += dst_bc->strides[is_uv];
    }
  }
  aom_yv12_extend_frame_borders_c(dst_bc, num_planes);
}